

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O2

Gia_Man_t * Abc_GenSignedBooth(int nArgN,int nArgM)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Gia_Man_t *p_02;
  Gia_Man_t *pGVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  
  iVar3 = nArgM + nArgN;
  iVar8 = nArgM + 1 + nArgN;
  iVar13 = (nArgM + 1) / 2;
  iVar9 = iVar13 + 1;
  p = Vec_IntAlloc(iVar9 * iVar8);
  p_00 = Vec_IntAlloc(nArgN + 2);
  p_01 = Vec_IntAlloc(nArgM + 2);
  piVar1 = p_00->pArray;
  piVar2 = p_01->pArray;
  pcVar10 = (char *)0x3e8;
  p_02 = Gia_ManStart(1000);
  pcVar10 = Abc_UtilStrsav(pcVar10);
  p_02->pName = pcVar10;
  Vec_IntPush(p_00,0);
  iVar12 = 0;
  if (0 < nArgN) {
    iVar12 = nArgN;
  }
  while (bVar16 = iVar12 != 0, iVar12 = iVar12 + -1, bVar16) {
    iVar4 = Gia_ManAppendCi(p_02);
    Vec_IntPush(p_00,iVar4);
  }
  iVar12 = Vec_IntEntryLast(p_00);
  Vec_IntPush(p_00,iVar12);
  Vec_IntPush(p_01,0);
  iVar12 = 0;
  if (0 < nArgM) {
    iVar12 = nArgM;
  }
  while (bVar16 = iVar12 != 0, iVar12 = iVar12 + -1, bVar16) {
    iVar4 = Gia_ManAppendCi(p_02);
    Vec_IntPush(p_01,iVar4);
  }
  iVar12 = Vec_IntEntryLast(p_01);
  Vec_IntPush(p_01,iVar12);
  for (uVar15 = 0; (long)uVar15 <= (long)iVar3; uVar15 = uVar15 + 1) {
    iVar12 = 0;
    if ((int)((uint)(uVar15 >> 1) & 0x7fffffff) < iVar13 && (uVar15 & 1) == 0) {
      iVar12 = piVar2[uVar15 + 2];
    }
    Vec_IntPush(p,iVar12);
  }
  Gia_ManHashAlloc(p_02);
  uVar15 = 0;
  do {
    uVar14 = uVar15;
    if ((long)(iVar13 * 2) <= (long)uVar15) {
      Gia_ManHashStop(p_02);
      iVar13 = 0;
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      if (iVar9 < 1) {
        iVar9 = 0;
      }
      for (iVar12 = 0; iVar4 = iVar3, iVar11 = iVar13, iVar12 != iVar9; iVar12 = iVar12 + 1) {
        while (iVar4 != 0) {
          iVar6 = Vec_IntEntry(p,iVar11);
          Gia_ManAppendCo(p_02,iVar6);
          iVar4 = iVar4 + -1;
          iVar11 = iVar11 + 1;
        }
        iVar13 = iVar13 + iVar8;
      }
      Vec_IntFree(p);
      Vec_IntFree(p_00);
      Vec_IntFree(p_01);
      pGVar7 = Gia_ManCleanup(p_02);
      Gia_ManStop(p_02);
      return pGVar7;
    }
    while (uVar14 != 0) {
      Vec_IntPush(p,0);
      uVar14 = uVar14 - 1;
    }
    for (uVar14 = 0; (long)uVar14 <= (long)nArgN; uVar14 = uVar14 + 1) {
      uVar5 = Abc_GenSignedBoothPP
                        (p_02,piVar1[uVar14],piVar1[uVar14 + 1],piVar2[uVar15],piVar2[uVar15 | 1],
                         piVar2[uVar15 + 2]);
      if ((int)uVar5 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      Vec_IntPush(p,uVar5 ^ ((uint)nArgN == uVar14 && uVar15 != 0));
    }
    iVar4 = Vec_IntEntryLast(p);
    iVar12 = iVar4;
    if (uVar15 != 0) {
      iVar12 = 1;
    }
    Vec_IntPush(p,iVar12);
    iVar11 = nArgN + 2 + (int)uVar15;
    for (iVar12 = iVar11; iVar12 <= iVar3; iVar12 = iVar12 + 1) {
      iVar6 = 0;
      if (iVar12 <= iVar11 && uVar15 == 0) {
        iVar6 = Abc_LitNot(iVar4);
      }
      Vec_IntPush(p,iVar6);
    }
    uVar15 = uVar15 + 2;
  } while( true );
}

Assistant:

Gia_Man_t * Abc_GenSignedBooth( int nArgN, int nArgM )
{
    int nWidth = nArgN + nArgM + 1;
    int Length = (nArgM + 1) / 2;
    int i, k, iLit;

    Vec_Int_t * vPPs  = Vec_IntAlloc( nWidth * (Length + 1) );
    Vec_Int_t * vArgN = Vec_IntAlloc( nArgN + 2 );
    Vec_Int_t * vArgM = Vec_IntAlloc( nArgM + 2 );
    int * pArgN = Vec_IntArray( vArgN );
    int * pArgM = Vec_IntArray( vArgM );

    Gia_Man_t * pTemp, * pNew; 
    pNew = Gia_ManStart( 1000 );
    pNew->pName = Abc_UtilStrsav( "booth" );

    Vec_IntPush( vArgN, 0 );
    for ( i = 0; i < nArgN; i++ )
        Vec_IntPush( vArgN, Gia_ManAppendCi(pNew) );
    Vec_IntPush( vArgN, Vec_IntEntryLast(vArgN) );

    Vec_IntPush( vArgM, 0 );
    for ( i = 0; i < nArgM; i++ )
        Vec_IntPush( vArgM, Gia_ManAppendCi(pNew) );
    Vec_IntPush( vArgM, Vec_IntEntryLast(vArgM) );

    for ( i = 0; i < nWidth; i++ )
        Vec_IntPush( vPPs, (i%2 == 0 && i/2 < Length) ? pArgM[i+2] : 0 );

    Gia_ManHashAlloc( pNew );
    for ( k = 0; k < 2*Length; k += 2 )
    {
        for ( i = 0; i < k; i++ )
            Vec_IntPush( vPPs, 0 );
        for ( i = 0; i <= nArgN; i++ )
        {
            iLit = Abc_GenSignedBoothPP( pNew, pArgN[i], pArgN[i+1], pArgM[k], pArgM[k+1], pArgM[k+2] );
            Vec_IntPush( vPPs, Abc_LitNotCond( iLit, k > 0 && i == nArgN ) );
        }
        iLit = Vec_IntEntryLast(vPPs);
        Vec_IntPush( vPPs, k > 0 ? 1 : iLit );
        for ( i = k+nArgN+2; i < nWidth; i++ )
            Vec_IntPush( vPPs, (k > 0 || i > k+nArgN+2) ? 0 : Abc_LitNot(iLit) );
    }
    Gia_ManHashStop( pNew );

    for ( k = 0; k <= Length; k++ )
        for ( i = 0; i < nArgN+nArgM; i++ )
            Gia_ManAppendCo( pNew, Vec_IntEntry(vPPs, k*(nArgN+nArgM+1) + i) );
    Vec_IntFree( vPPs );
    Vec_IntFree( vArgN );
    Vec_IntFree( vArgM );

    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}